

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.cpp
# Opt level: O3

bool WriteDSK(FILE *f_,shared_ptr<Disk> *disk)

{
  undefined4 uVar1;
  pointer __src;
  byte bVar2;
  uint3 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  shared_ptr<Disk> *psVar9;
  byte bVar10;
  bool bVar11;
  uint8_t uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  unsigned_short uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uint8_t *__ptr;
  Track *this;
  Sector *pSVar23;
  char *pcVar24;
  Data *pDVar25;
  long lVar26;
  uint8_t *puVar27;
  undefined7 uVar30;
  size_t sVar28;
  exception *peVar29;
  byte bVar31;
  DataRate datarate;
  uint uVar32;
  FILE *__stream;
  uint8_t *puVar33;
  uint uVar34;
  uint8_t *__dest;
  vector<unsigned_short,_std::allocator<unsigned_short>_> offsets;
  Sector sector;
  CylHead cylhead;
  Sector typical;
  uint local_26c;
  uint local_250;
  uint local_24c;
  ulong local_248;
  uint local_23c;
  Header local_238;
  undefined1 local_228 [16];
  unsigned_short *local_218;
  Track *local_210;
  uint8_t *local_208;
  ulong local_200;
  ulong local_1f8;
  int local_1f0;
  uint local_1ec;
  Sector local_1e8;
  FILE *local_1a8;
  shared_ptr<Disk> *local_1a0;
  undefined1 *local_198;
  CylHead local_190;
  uint8_t *local_188;
  uint8_t *local_180;
  undefined1 local_178 [40];
  vector<Data,_std::allocator<Data>_> local_150;
  char local_138 [48];
  byte local_108;
  byte local_107;
  undefined1 local_104 [212];
  byte bVar3;
  
  local_1a8 = (FILE *)f_;
  local_1a0 = disk;
  __ptr = AllocMem(0xff00);
  memset(local_138 + 0x22,0,0xde);
  builtin_strncpy(local_138,"EXTENDED CPC DSK File\r\nDisk-Info\r\n",0x22);
  util::fmt_abi_cxx11_((string *)local_178,"SAMdisk%02u%02u%02u",0x19,4);
  pcVar24 = (char *)CONCAT17(local_178[7],CONCAT52(local_178._2_5_,local_178._0_2_));
  strncpy(local_138 + 0x22,pcVar24,0xe);
  if (pcVar24 != local_178 + 0x10) {
    operator_delete(pcVar24,local_178._16_8_ + 1);
  }
  psVar9 = local_1a0;
  iVar17 = Disk::cyls((local_1a0->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_108 = (byte)iVar17;
  uVar18 = Disk::heads((psVar9->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  __stream = local_1a8;
  local_107 = (byte)uVar18;
  if ((ulong)local_108 < 0x67) {
    if ((uVar18 & 0xff) < 3) {
      local_228 = (undefined1  [16])0x0;
      local_218 = (unsigned_short *)0x0;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_228,
                 (ulong)(uVar18 & 0xff) * ((ulong)local_108 + 1));
      fseek(__stream,0x100,0);
      if (local_108 == 0) {
        bVar7 = true;
      }
      else {
        local_198 = local_104;
        local_188 = __ptr + 0xd;
        bVar7 = true;
        local_26c = 0;
        bVar10 = local_108;
        bVar31 = local_107;
        do {
          uVar18 = 0;
          if (bVar31 == 0) {
            bVar31 = 0;
          }
          else {
            do {
              CylHead::CylHead(&local_190,local_26c,uVar18);
              this = Disk::read_track((local_1a0->
                                      super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                                      &local_190,false);
              bVar11 = Track::is_mixed_encoding(this);
              if (bVar11) {
                peVar29 = (exception *)__cxa_allocate_exception(0x10);
                util::exception::exception<CylHead&,char_const(&)[46]>
                          (peVar29,&local_190,
                           (char (*) [46])" is mixed-density, which EDSK doesn\'t support");
                __cxa_throw(peVar29,&util::exception::typeinfo,std::runtime_error::~runtime_error);
              }
              uVar34 = this->tracklen;
              uVar32 = uVar34 + 0xf;
              if (-1 < (int)uVar34) {
                uVar32 = uVar34;
              }
              local_178._0_2_ = (undefined2)(uVar32 >> 4);
              if ((unsigned_short *)local_228._8_8_ == local_218) {
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_228,
                           (iterator)local_228._8_8_,(unsigned_short *)local_178);
              }
              else {
                *(undefined2 *)local_228._8_8_ = local_178._0_2_;
                local_228._8_8_ = (unsigned_short *)(local_228._8_8_ + 2);
              }
              local_238.cyl = 0;
              local_238.head = 0;
              local_238.sector = 0;
              local_238.size = 0;
              Sector::Sector(&local_1e8,Unknown,Unknown,&local_238,0);
              GetTypicalSector((Sector *)local_178,&local_190,this,&local_1e8);
              std::vector<Data,_std::allocator<Data>_>::~vector(&local_1e8.m_data);
              iVar17 = Track::size(this);
              uVar34 = iVar17 * 8 + 0x117U & 0xffffff00;
              local_208 = (uint8_t *)(long)(int)uVar34;
              sVar28 = 0;
              if (uVar34 != 0) {
                sVar28 = (long)local_208 - 0xd;
              }
              memset(local_188,0,sVar28);
              __ptr[0] = 'T';
              __ptr[1] = 'r';
              __ptr[2] = 'a';
              __ptr[3] = 'c';
              __ptr[4] = 'k';
              __ptr[5] = '-';
              __ptr[6] = 'I';
              __ptr[7] = 'n';
              __ptr[5] = '-';
              __ptr[6] = 'I';
              __ptr[7] = 'n';
              __ptr[8] = 'f';
              __ptr[9] = 'o';
              __ptr[10] = '\r';
              __ptr[0xb] = '\n';
              __ptr[0xc] = '\0';
              __ptr[0x10] = (uint8_t)local_26c;
              __ptr[0x11] = (uint8_t)uVar18;
              iVar17 = Track::size(this);
              __ptr[0x15] = (uint8_t)iVar17;
              __ptr[0x17] = 0xe5;
              iVar19 = Track::size(this);
              iVar17 = 2;
              if (iVar19 != 0) {
                iVar17 = local_178._12_4_;
              }
              __ptr[0x14] = (uint8_t)iVar17;
              uVar12 = (uint8_t)local_178._28_4_;
              if (local_178._28_4_ == 0) {
                uVar12 = 'N';
              }
              __ptr[0x16] = uVar12;
              iVar17 = Track::size(this);
              if (iVar17 == 0) {
                datarate = Unknown;
              }
              else {
                pSVar23 = Track::operator[](this,0);
                datarate = pSVar23->datarate;
              }
              iVar17 = Track::size(this);
              if (iVar17 == 0) {
                bVar11 = false;
              }
              else {
                pSVar23 = Track::operator[](this,0);
                bVar11 = pSVar23->encoding == FM;
              }
              uVar12 = '\0';
              if ((int)datarate < 500000) {
                if ((datarate == _250K) || (uVar12 = '\0', datarate == _300K)) {
                  uVar12 = '\x01';
                }
              }
              else if (datarate == _500K) {
                uVar12 = '\x02';
              }
              else if (datarate == _1M) {
                uVar12 = '\x03';
              }
              __ptr[0x12] = uVar12;
              __ptr[0x13] = bVar11;
              iVar17 = opt.legacy;
              iVar19 = GetUnformatSizeCode(datarate);
              local_24c = Sector::SizeCodeToLength(iVar19);
              local_208 = __ptr + (long)local_208;
              uVar32 = 0;
              local_248 = 0;
              local_1f8 = 0;
              local_200 = 0;
              local_23c = uVar34;
              local_210 = this;
              bVar11 = iVar17 != 0;
              while (bVar8 = bVar11, uVar34 = local_23c, iVar17 = Track::size(this), iVar17 != 0) {
                puVar27 = __ptr;
                uVar32 = uVar34;
                local_250 = uVar34;
                if (__ptr[0x15] != '\0') {
                  puVar33 = (uint8_t *)0x0;
                  __dest = local_208;
                  do {
                    local_180 = puVar33;
                    pSVar23 = Track::operator[](this,(int)puVar33);
                    uVar1 = *(undefined4 *)((long)&pSVar23->gap3 + 3);
                    local_1e8.dam = (uint8_t)((uint)uVar1 >> 8);
                    local_1e8._33_2_ = SUB42((uint)uVar1 >> 0x10,0);
                    local_1e8.header.cyl = (pSVar23->header).cyl;
                    local_1e8.header.head = (pSVar23->header).head;
                    local_1e8.header.sector = (pSVar23->header).sector;
                    local_1e8.header.size = (pSVar23->header).size;
                    local_1e8.datarate = pSVar23->datarate;
                    local_1e8.encoding = pSVar23->encoding;
                    uVar5 = pSVar23->offset;
                    uVar6 = pSVar23->gap3;
                    local_1e8.offset = uVar5;
                    local_1e8.gap3 = uVar6;
                    std::vector<Data,_std::allocator<Data>_>::vector
                              (&local_1e8.m_data,&pSVar23->m_data);
                    if (local_1e8.offset != 0U && (local_248 & 1) == 0) {
                      uVar34 = local_1e8.offset + 0xf;
                      if (-1 < local_1e8.offset) {
                        uVar34 = local_1e8.offset;
                      }
                      uVar16 = (unsigned_short)(uVar34 >> 4);
                      local_238.cyl._0_2_ = uVar16;
                      if ((unsigned_short *)local_228._8_8_ == local_218) {
                        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                        _M_realloc_insert<unsigned_short>
                                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                   local_228,(iterator)local_228._8_8_,(unsigned_short *)&local_238)
                        ;
                      }
                      else {
                        *(unsigned_short *)local_228._8_8_ = uVar16;
                        local_228._8_8_ = (unsigned_short *)(local_228._8_8_ + 2);
                      }
                    }
                    else {
                      bVar7 = (bool)(bVar7 & local_1e8.offset != 0U);
                    }
                    iVar17 = 200000;
                    if (local_1e8.datarate == _300K) {
                      iVar17 = 0x28b0b;
                    }
                    iVar17 = GetTrackCapacity(iVar17,local_1e8.datarate,local_1e8.encoding);
                    if ((local_1e8.dam != 0xf8) && (local_1e8.dam != 0xfb)) {
                      pcVar24 = CHR(local_26c,uVar18,local_1e8.header.sector);
                      local_238._0_8_ = pcVar24;
                      Message<char_const*,unsigned_char&>
                                (msgWarning,"discarding data from %s due to non-standard DAM %02x",
                                 (char **)&local_238,&local_1e8.dam);
                      Sector::remove_data(&local_1e8);
                    }
                    bVar11 = Sector::has_badidcrc(&local_1e8);
                    bVar13 = Sector::has_badidcrc(&local_1e8);
                    if (bVar13) {
                      bVar13 = false;
                    }
                    else {
                      bVar13 = Sector::has_data(&local_1e8);
                      bVar13 = !bVar13;
                    }
                    bVar14 = Sector::has_baddatacrc(&local_1e8);
                    bVar15 = Sector::is_deleted(&local_1e8);
                    bVar10 = bVar13 | 0x20;
                    if (!bVar14) {
                      bVar10 = bVar13;
                    }
                    bVar31 = bVar10 + 0x40;
                    if (!bVar15) {
                      bVar31 = bVar10;
                    }
                    local_1ec = (uint)bVar31;
                    iVar19 = Sector::copies(&local_1e8);
                    uVar20 = Sector::data_size(&local_1e8);
                    local_1f0 = iVar17;
                    uVar21 = Sector::size(&local_1e8);
                    uVar34 = local_24c;
                    if ((int)uVar20 < (int)local_24c) {
                      uVar34 = uVar20;
                    }
                    if (local_1e8.header.size < 8) {
                      uVar34 = uVar20;
                    }
                    uVar20 = uVar34;
                    if ((iVar19 < 2) ||
                       (bVar13 = Track::is_8k_sector(local_210), uVar20 = uVar21,
                       bVar13 || uVar34 == uVar21)) {
                      if ((local_1f0 < (int)uVar20) &&
                         (bVar13 = Track::is_8k_sector(local_210), !bVar13)) {
                        iVar19 = 1;
                      }
                    }
                    else if ((int)uVar21 < (int)uVar34) {
                      pcVar24 = CHR(local_26c,uVar18,local_1e8.header.sector);
                      local_238._0_8_ = pcVar24;
                      Message<char_const*>
                                (msgWarning,"discarding gaps from multiple copies of %s",
                                 (char **)&local_238);
                    }
                    else if ((local_1e8.offset != 0) &&
                            ((int)(local_1e8.offset + uVar21) < local_210->tracklen)) {
                      pcVar24 = CHR(local_26c,uVar18,local_1e8.header.sector);
                      local_238._0_8_ = pcVar24;
                      Message<char_const*>
                                (msgWarning,"short data field in multiple copies of %s",
                                 (char **)&local_238);
                    }
                    if ((local_1f8 & 1) != 0) {
                      bVar13 = Sector::has_baddatacrc(&local_1e8);
                      iVar17 = 1;
                      if (iVar19 < 1) {
                        iVar17 = iVar19;
                      }
                      if (bVar13) {
                        iVar19 = iVar17;
                      }
                    }
                    if ((local_200 & 1) != 0) {
                      bVar13 = Sector::has_baddatacrc(&local_1e8);
                      uVar34 = local_24c;
                      if ((int)uVar20 < (int)local_24c) {
                        uVar34 = uVar20;
                      }
                      if (bVar13) {
                        uVar20 = uVar34;
                      }
                    }
                    if (bVar8) {
                      if (0 < iVar19) {
                        iVar19 = 1;
                      }
                      uVar34 = 0x1800;
                      if ((int)uVar20 < 0x1800) {
                        uVar34 = uVar20;
                      }
                      if (local_1e8.header.size != 6) {
                        uVar34 = uVar20;
                      }
                      if (6 < local_1e8.header.size) {
                        uVar34 = 0;
                      }
                      uVar20 = uVar34;
                      if ((int)uVar21 <= (int)uVar34) {
                        uVar20 = uVar21;
                      }
                    }
                    if (0 < iVar19) {
                      iVar17 = 0;
                      do {
                        pDVar25 = Sector::data_copy(&local_1e8,iVar17);
                        if ((int)(uVar32 + uVar20) < 0xff00) {
                          __src = (pDVar25->
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                          iVar22 = (int)(pDVar25->
                                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
                                        .
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (int)__src;
                          if (iVar22 < (int)uVar20) {
                            memcpy(__dest,__src,(long)iVar22);
                            iVar22 = (int)(pDVar25->
                                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ).
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                     (int)(pDVar25->
                                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ).
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                            memset(__dest + iVar22,0,(long)(int)(uVar20 - iVar22));
                          }
                          else {
                            memcpy(__dest,__src,(long)(int)uVar20);
                          }
                          if (uVar20 == 0) {
                            uVar20 = 0;
                          }
                          else {
                            iVar22 = Sector::copies(&local_1e8);
                            if (((iVar22 == 1) &&
                                (bVar13 = Sector::has_baddatacrc(&local_1e8),
                                bVar13 && uVar20 != uVar21)) && ((int)uVar20 % (int)uVar21 == 0)) {
                              lVar26 = (long)(int)uVar20;
                              uVar20 = uVar20 + 1;
                              __dest[lVar26] = '{';
                            }
                          }
                        }
                        __dest = __dest + (int)uVar20;
                        uVar32 = uVar20 + local_250;
                        iVar17 = iVar17 + 1;
                        local_250 = uVar32;
                      } while (iVar19 != iVar17);
                    }
                    puVar33 = local_180;
                    bVar10 = ((local_1e8.header._0_8_ & 0xff) != 0) *
                             (((ushort)local_1e8.header.cyl & 0xff) < 0x100) *
                             (char)local_1e8.header.cyl -
                             (0xff < ((ushort)local_1e8.header.cyl & 0xff));
                    bVar31 = ((local_1e8.header._0_8_ & 0xff00000000) != 0) *
                             (((ushort)local_1e8.header.head & 0xff) < 0x100) *
                             (char)local_1e8.header.head -
                             (0xff < ((ushort)local_1e8.header.head & 0xff));
                    bVar2 = ((local_1e8.header._8_8_ & 0xff) != 0) *
                            (((ushort)local_1e8.header.sector & 0xff) < 0x100) *
                            (char)local_1e8.header.sector -
                            (0xff < ((ushort)local_1e8.header.sector & 0xff));
                    bVar3 = ((local_1e8.header._8_8_ & 0xff00000000) != 0) *
                            (((ushort)local_1e8.header.size & 0xff) < 0x100) *
                            (char)local_1e8.header.size -
                            (0xff < ((ushort)local_1e8.header.size & 0xff));
                    *(uint *)(__ptr + (long)local_180 * 8 + 0x18) =
                         CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                  CONCAT12((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                           CONCAT11((bVar31 != 0) * (bVar31 < 0x100) * bVar31 -
                                                    (0xff < bVar31),
                                                    (bVar10 != 0) * (bVar10 < 0x100) * bVar10 -
                                                    (0xff < bVar10))));
                    __ptr[(long)local_180 * 8 + 0x1c] = (bVar11 || bVar14) << 5;
                    __ptr[(long)local_180 * 8 + 0x1d] = (uint8_t)local_1ec;
                    __ptr[(long)local_180 * 8 + 0x1e] = (uint8_t)(uVar20 * iVar19);
                    __ptr[(long)local_180 * 8 + 0x1f] = (uint8_t)(uVar20 * iVar19 >> 8);
                    std::vector<Data,_std::allocator<Data>_>::~vector(&local_1e8.m_data);
                    puVar33 = puVar33 + 1;
                    puVar27 = (uint8_t *)(ulong)__ptr[0x15];
                    this = local_210;
                  } while (puVar33 < puVar27);
                }
                if ((int)uVar32 < 0xff01) {
                  memset(__ptr + (int)uVar32,0,(ulong)(0xff00 - uVar32));
                  break;
                }
                uVar30 = (undefined7)((ulong)puVar27 >> 8);
                bVar11 = bVar8;
                if ((local_1f8 & 1) == 0) {
                  local_248 = CONCAT71(uVar30,1);
                  local_1f8 = CONCAT71(uVar30,1);
                }
                else if ((local_200 & 1) == 0) {
                  local_248 = CONCAT71(uVar30,1);
                  local_200 = CONCAT71(uVar30,1);
                }
                else {
                  uVar4 = (uint3)(local_24c >> 8);
                  if ((int)local_24c < 0x81) {
                    local_248 = CONCAT71((uint7)uVar4,1);
                    bVar11 = true;
                    if (bVar8) {
                      peVar29 = (exception *)__cxa_allocate_exception(0x10);
                      local_1e8.header.cyl = 0xff00;
                      util::exception::
                      exception<CylHead&,char_const(&)[8],int&,char_const(&)[29],int,char_const(&)[2]>
                                (peVar29,&local_190,(char (*) [8])0x1b2e9d,(int *)&local_250,
                                 (char (*) [29])") exceeds EDSK track limit (",(int *)&local_1e8,
                                 (char (*) [2])0x1aefd0);
                      __cxa_throw(peVar29,&util::exception::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                  }
                  else {
                    local_24c = local_24c >> 1;
                    local_248 = CONCAT71((uint7)(uVar4 >> 1),1);
                  }
                }
              }
              __stream = local_1a8;
              local_250 = uVar32 + 0xff & 0xffffff00;
              *local_198 = (char)(uVar32 + 0xff >> 8);
              local_198 = local_198 + 1;
              fwrite(__ptr,(long)(int)local_250,1,local_1a8);
              std::vector<Data,_std::allocator<Data>_>::~vector(&local_150);
              uVar18 = uVar18 + 1;
              bVar10 = local_108;
              bVar31 = local_107;
            } while (uVar18 < local_107);
          }
          local_26c = local_26c + 1;
        } while (local_26c < bVar10);
      }
      if ((opt.legacy == 0) && (bVar7)) {
        local_178._8_4_ = 0xd6f666e;
        local_178._12_3_ = 10;
        local_178._0_2_ = 0x664f;
        local_178._2_5_ = 0x2d74657366;
        local_178[7] = 0x49;
        fwrite(local_178,0xf,1,__stream);
        fwrite((void *)local_228._0_8_,(long)(local_228._8_8_ - local_228._0_8_) >> 1,2,__stream);
      }
      fseek(__stream,0,0);
      sVar28 = fwrite(local_138,0x100,1,__stream);
      if (sVar28 == 0) {
        peVar29 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[12]>(peVar29,(char (*) [12])"write error");
        __cxa_throw(peVar29,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      fseek(__stream,0,2);
      if ((pointer)local_228._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_228._0_8_,(long)local_218 - local_228._0_8_);
      }
      FreeMem(__ptr);
      return true;
    }
    peVar29 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[24]>(peVar29,(char (*) [24])"too many heads for EDSK");
  }
  else {
    peVar29 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[28]>
              (peVar29,(char (*) [28])"too many cylinders for EDSK");
  }
  __cxa_throw(peVar29,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool WriteDSK(FILE* f_, std::shared_ptr<Disk>& disk)
{
    MEMORY mem(ESDK_MAX_TRACK_SIZE);
    auto pbTrack = mem.pb;

    uint8_t abHeader[256] = {}; // EDSK file header is fixed at 256 bytes - don't change!
    auto peh = reinterpret_cast<EDSK_HEADER*>(abHeader);
    auto pbIndex = reinterpret_cast<uint8_t*>(peh + 1);
    auto max_cyls = (sizeof(abHeader) - sizeof(EDSK_HEADER)) / MAX_SIDES;

    memcpy(peh->szSignature, EDSK_SIGNATURE, sizeof(EDSK_SIGNATURE) - 1);
    strncpy(peh->szCreator, util::fmt("SAMdisk%02u%02u%02u", YEAR % 100, MONTH + 1, DAY).c_str(), sizeof(peh->szCreator));

    peh->bTracks = static_cast<uint8_t>(disk->cyls());
    peh->bSides = static_cast<uint8_t>(disk->heads());

    if (peh->bTracks > max_cyls)
        throw util::exception("too many cylinders for EDSK");
    else if (peh->bSides > MAX_SIDES)
        throw util::exception("too many heads for EDSK");

    bool add_offsets_block = true;
    std::vector<uint16_t> offsets;
    offsets.reserve((peh->bTracks + 1) * peh->bSides);

    fseek(f_, sizeof(abHeader), SEEK_SET);

    for (uint8_t cyl = 0; cyl < peh->bTracks; ++cyl)
    {
        for (uint8_t head = 0; head < peh->bSides; ++head)
        {
            CylHead cylhead(cyl, head);
            auto& track = disk->read_track(cylhead);

            if (track.is_mixed_encoding())
                throw util::exception(cylhead, " is mixed-density, which EDSK doesn't support");

            bool added_sector_offsets = false;
            offsets.push_back(util::htole(static_cast<uint16_t>(track.tracklen / 16)));

            auto pt = reinterpret_cast<EDSK_TRACK*>(mem.pb);
            auto ps = reinterpret_cast<EDSK_SECTOR*>(pt + 1);

            Sector typical = GetTypicalSector(cylhead, track, Sector(DataRate::Unknown, Encoding::Unknown));

            // The standard track header is 256 bytes, but to allow more than 29 sectors we'll
            // round up the required size to the next 256-byte boundary
            int track_header_size = (sizeof(EDSK_TRACK) + track.size() * sizeof(EDSK_SECTOR) + 0xff) & ~0xff;

            memset(mem, 0, track_header_size);
            memcpy(pt->signature, EDSK_TRACK_SIG, sizeof(pt->signature));
            pt->track = cyl;
            pt->side = head;
            pt->sectors = static_cast<uint8_t>(track.size());
            pt->fill = 0xe5;
            pt->size = static_cast<uint8_t>(track.size() ? typical.header.size : EDSK_DEFAULT_SIZE);
            pt->gap3 = static_cast<uint8_t>(typical.gap3 ? typical.gap3 : EDSK_DEFAULT_GAP3);

            auto datarate = track.size() ? track[0].datarate : DataRate::Unknown;
            auto encoding = track.size() ? track[0].encoding : Encoding::Unknown;

            switch (datarate)
            {
            default:                pt->rate = 0;   break;
            case DataRate::_250K:   pt->rate = 1;   break;
            case DataRate::_300K:   pt->rate = 1;   break;
            case DataRate::_500K:   pt->rate = 2;   break;
            case DataRate::_1M:     pt->rate = 3;   break;
            }

            pt->encoding = (encoding == Encoding::FM) ? 1 : 0;

            // Assume 300rpm to determine approximate track capacity
            auto track_size = 0;

            // Space saving flags, to squeeze the track into the limited EDSK space
            bool fFitLegacy = !!opt.legacy;
            bool fFitErrorCopies = false, fFitErrorSize = false;
            auto uFitSize = Sector::SizeCodeToLength(GetUnformatSizeCode(datarate));

            // Loop to fit any sectors
            while (track.size())
            {
                // Start with the size of the track header
                track_size = track_header_size;

                // Point to the start of the data area and the sector space
                auto pb = mem + track_header_size;

                for (int i = 0; i < pt->sectors; ++i)
                {
                    auto sector = track[i];

                    // If any offsets are zero we can't generate append an offsets block.
                    if (!sector.offset)
                        add_offsets_block = false;
                    // Take care to only output offsets on the first pass around the fitting loop.
                    else if (!added_sector_offsets)
                        offsets.push_back(util::htole(static_cast<uint16_t>(sector.offset / 16)));

                    auto rpm_time = (sector.datarate == DataRate::_300K) ? RPM_TIME_360 : RPM_TIME_300;
                    auto track_capacity = GetTrackCapacity(rpm_time, sector.datarate, sector.encoding);

                    // Accept only normal and deleted DAMs, removing the data field for other types.
                    // Hercule II (CPC) has a non-standard DAM (0xFD), and expects it to be unreadable.
                    if (sector.dam != 0xfb && sector.dam != 0xf8)
                    {
                        Message(msgWarning, "discarding data from %s due to non-standard DAM %02x",
                            CHR(cyl, head, sector.header.sector), sector.dam);
                        sector.remove_data();
                    }

                    uint8_t status1 = 0, status2 = 0;
                    if (sector.has_badidcrc()) status1 |= SR1_CRC_ERROR;
                    if (!sector.has_badidcrc() && !sector.has_data()) status2 |= SR2_MISSING_ADDRESS_MARK;
                    if (sector.has_baddatacrc()) { status1 |= SR1_CRC_ERROR; status2 |= SR2_CRC_ERROR_IN_SECTOR_DATA; }
                    if (sector.is_deleted()) status2 |= SR2_SECTOR_WITH_DELETED_DATA;

                    auto num_copies = sector.copies();
                    auto data_size = sector.data_size();
                    auto real_size = sector.size();

                    // Clip extended sizes to the unformat size, to ensure we have a complete revolution
                    if (sector.header.size > 7 && data_size > uFitSize)
                        data_size = uFitSize;

                    // Preserve multiple copies on 8K tracks by extending them to full size
                    if (num_copies > 1 && track.is_8k_sector())
                        data_size = real_size;

                    // Warn if other error sectors are shorter than real size
                    if (num_copies > 1 && data_size != real_size)
                    {
                        if (data_size > real_size)
                            Message(msgWarning, "discarding gaps from multiple copies of %s", CHR(cyl, head, sector.header.sector));
                        else if (sector.offset && sector.offset + real_size < track.tracklen)
                            Message(msgWarning, "short data field in multiple copies of %s", CHR(cyl, head, sector.header.sector));

                        data_size = real_size;
                    }

                    // Drop extra copies on sectors larger than the track, unless it's
                    // an 8K sector with an error during the first 6K of data.
                    else if (data_size > track_capacity && !track.is_8k_sector())
                        num_copies = 1;

                    // Drop any extra copies of error sectors
                    if (fFitErrorCopies)
                    {
                        if (sector.has_baddatacrc() && num_copies > 1)
                            num_copies = 1;
                    }

                    // Cut extended sectors down to zero data
                    if (fFitErrorSize)
                    {
                        if (sector.has_baddatacrc() && data_size > uFitSize)
                            data_size = uFitSize;
                    }

                    // Force to legacy format?
                    if (fFitLegacy)
                    {
                        if (num_copies > 1) num_copies = 1;
                        if (sector.header.size == 6 && data_size > 6144) data_size = 6144;
                        if (sector.header.size >= 7) data_size = 0;
                        if (data_size > real_size) data_size = real_size;
                    }

                    // Copy the sector data into place
                    for (auto copy = 0; copy < num_copies; ++copy)
                    {
                        const Data& data = sector.data_copy(copy);

                        // Only copy if there's room - we'll check it fits later
                        if (track_size + data_size < mem.size)
                        {
                            if (data.size() >= data_size)
                                memcpy(pb, data.data(), data_size);
                            else
                            {
                                // Extend 8K sectors to full size to preserve multiple copies
                                memcpy(pb, data.data(), data.size());
                                memset(pb + data.size(), 0, data_size - data.size());
                            }

                            // Single copy data CRC error and size that conflicts with multiple copies extension?
                            if (data_size && sector.copies() == 1 && sector.has_baddatacrc() &&
                                data_size != real_size && (data_size % real_size) == 0)
                            {
                                // Write a dummy marker byte to the end of the data, and increment the stored size
                                pb[data_size++] = 123;
                            }
                        }

                        pb += data_size;
                        track_size += data_size;
                    }

                    ps[i].track = static_cast<uint8_t>(sector.header.cyl);
                    ps[i].side = static_cast<uint8_t>(sector.header.head);
                    ps[i].sector = static_cast<uint8_t>(sector.header.sector);
                    ps[i].size = static_cast<uint8_t>(sector.header.size);
                    ps[i].status1 = status1;
                    ps[i].status2 = status2;

                    data_size *= num_copies;
                    ps[i].datalow = data_size & 0xff;
                    ps[i].datahigh = static_cast<uint8_t>(data_size >> 8);
                }

                // If the track fits, we're done
                if (track_size <= mem.size)
                {
                    // Clear any unused space, then break out to save it
                    memset(mem + track_size, 0, mem.size - track_size);
                    break;
                }

                // Flag that sector offsets have already been generated.
                added_sector_offsets = true;

                // Try again using various techniques to make it fit
                if (!fFitErrorCopies) { fFitErrorCopies = true; continue; }
                if (!fFitErrorSize) { fFitErrorSize = true; continue; }
                if (uFitSize > 128) { uFitSize /= 2; continue; }
                if (!fFitLegacy) { fFitLegacy = true; continue; }

                // If we run out of methods, fail
                throw util::exception(cylhead, " size (", track_size, ") exceeds EDSK track limit (", ESDK_MAX_TRACK_SIZE, ")");
            }

            // Round the size up to the next 256-byte boundary, and store the MSB in the index
            track_size = (track_size + 0xff) & ~0xff;
            *pbIndex++ = static_cast<uint8_t>(track_size >> 8);

            // Write the track to the image
            fwrite(pbTrack, track_size, 1, f_);
        }
    }

    // Add offsets if available, unless they're disabled
    if (!opt.legacy && add_offsets_block)
    {
        EDSK_OFFSETS eo = { EDSK_OFFSETS_SIG, 0 };
        fwrite(&eo, sizeof(eo), 1, f_);
        fwrite(offsets.data(), offsets.size(), sizeof(uint16_t), f_);
    }

    fseek(f_, 0, SEEK_SET);
    if (!fwrite(abHeader, sizeof(abHeader), 1, f_))
        throw util::exception("write error");
    fseek(f_, 0, SEEK_END);

    return true;
}